

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void __thiscall RTQuaternion::normalize(RTQuaternion *this)

{
  float fVar1;
  double dVar2;
  RTFLOAT length;
  RTQuaternion *this_local;
  
  dVar2 = std::sqrt((double)(ulong)(uint)(this->m_data[3] * this->m_data[3] +
                                         this->m_data[2] * this->m_data[2] +
                                         this->m_data[0] * this->m_data[0] +
                                         this->m_data[1] * this->m_data[1]));
  fVar1 = SUB84(dVar2,0);
  if (((fVar1 != 0.0) || (NAN(fVar1))) && ((fVar1 != 1.0 || (NAN(fVar1))))) {
    this->m_data[0] = this->m_data[0] / fVar1;
    this->m_data[1] = this->m_data[1] / fVar1;
    this->m_data[2] = this->m_data[2] / fVar1;
    this->m_data[3] = this->m_data[3] / fVar1;
  }
  return;
}

Assistant:

void RTQuaternion::normalize()
{
    RTFLOAT length = sqrt(m_data[0] * m_data[0] + m_data[1] * m_data[1] +
            m_data[2] * m_data[2] + m_data[3] * m_data[3]);

    if ((length == 0) || (length == 1))
        return;

    m_data[0] /= length;
    m_data[1] /= length;
    m_data[2] /= length;
    m_data[3] /= length;
}